

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QVersionNumber *version)

{
  QTextStream *pQVar1;
  anon_union_8_3_e50c5c22_for_SegmentStorage_0 aVar2;
  storage_type *in_RCX;
  QVersionNumber *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QString local_60;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,(QDebug *)version);
  pQVar1 = (QTextStream *)(version->m_segments).field_0.pointer_segments;
  *(undefined2 *)&pQVar1[3]._vptr_QTextStream = 0x100;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QVersionNumber(";
  QString::fromUtf8(&local_40,(QString *)0xf,ba);
  QTextStream::operator<<(pQVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(version->m_segments).field_0.pointer_segments;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar1,' ');
  }
  QVersionNumber::toString(&local_60,in_RDX);
  if ((QChar *)local_60.d.ptr == (QChar *)0x0) {
    local_60.d.ptr = L"";
  }
  QDebug::putString((QDebug *)version,(QChar *)local_60.d.ptr,local_60.d.size);
  pQVar1 = (QTextStream *)(version->m_segments).field_0.pointer_segments;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar1,' ');
  }
  pQVar1 = (QTextStream *)(version->m_segments).field_0.pointer_segments;
  ba_00.m_data = in_RCX;
  ba_00.m_size = (qsizetype)")";
  QString::fromUtf8(&local_40,(QString *)0x1,ba_00);
  QTextStream::operator<<(pQVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)(version->m_segments).field_0.pointer_segments;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar1,' ');
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  aVar2 = (version->m_segments).field_0;
  (version->m_segments).field_0.dummy = 0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)aVar2;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QVersionNumber &version)
{
    QDebugStateSaver saver(debug);
    debug.nospace().noquote();
    debug << "QVersionNumber(" << version.toString() << ")";
    return debug;
}